

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O1

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs *cmd,int argc,char **argv)

{
  MPP_RET MVar1;
  RK_S32 RVar2;
  long lVar3;
  MppOpt opts;
  
  opts = (MppOpt)0x0;
  MVar1 = MPP_NOK;
  if ((argv != (char **)0x0 && cmd != (MpiEncTestArgs *)0x0) && 1 < argc) {
    cmd->rc_mode = 5;
    mpp_opt_init(&opts);
    mpp_opt_setup(opts,cmd);
    lVar3 = 0;
    do {
      mpp_opt_add(opts,(MppOptInfo *)((long)&enc_opts[0].name + lVar3));
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0x4e0);
    mpp_opt_add(opts,(MppOptInfo *)0x0);
    MVar1 = mpp_opt_parse(opts,argc,argv);
    if (cmd->type < MPP_VIDEO_CodingMPEG2) {
      _mpp_log_l(2,"mpi_enc_utils","invalid type %d\n",0);
      MVar1 = MPP_NOK;
    }
    if (cmd->rc_mode == 5) {
      cmd->rc_mode = (uint)(cmd->type == MPP_VIDEO_CodingMJPEG) * 2;
    }
    if (cmd->hor_stride == 0) {
      RVar2 = mpi_enc_width_default_stride(cmd->width,cmd->format);
      cmd->hor_stride = RVar2;
    }
    if (cmd->ver_stride == 0) {
      cmd->ver_stride = cmd->height + 1U & 0xfffffffe;
    }
    if ((cmd->type_src == MPP_VIDEO_CodingUnused) &&
       ((((cmd->width < 1 || (cmd->height < 1)) || (cmd->hor_stride < 1)) || (cmd->ver_stride < 1)))
       ) {
      _mpp_log_l(2,"mpi_enc_utils","invalid w:h [%d:%d] stride [%d:%d]\n",0,cmd->width,cmd->height,
                 cmd->hor_stride,cmd->ver_stride);
      MVar1 = MPP_NOK;
    }
    if (((cmd->rc_mode == 2) && (cmd->qp_init == 0)) &&
       ((cmd->type == MPP_VIDEO_CodingHEVC || (cmd->type == MPP_VIDEO_CodingAVC)))) {
      cmd->qp_init = 0x1a;
    }
    if (cmd->trace_fps != 0) {
      fps_calc_init(&cmd->fps);
      if ((cmd->fps == (FpsCalc)0x0) &&
         (_mpp_log_l(2,"mpi_enc_utils","Assertion %s failed at %s:%d\n",0,"cmd->fps",
                     "mpi_enc_test_cmd_update_by_args",0x370), (DAT_00117343 & 0x10) != 0)) {
        abort();
      }
      fps_calc_set_cb(cmd->fps,show_enc_fps);
    }
  }
  if (opts != (MppOpt)0x0) {
    mpp_opt_deinit(opts);
    opts = (MppOpt)0x0;
  }
  if (MVar1 != MPP_OK) {
    mpi_enc_show_help(*argv);
  }
  return MVar1;
}

Assistant:

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs* cmd, int argc, char **argv)
{
    MppOpt opts = NULL;
    RK_S32 ret = -1;
    RK_U32 i;

    if ((argc < 2) || NULL == cmd || NULL == argv)
        goto done;

    cmd->rc_mode = MPP_ENC_RC_MODE_BUTT;

    mpp_opt_init(&opts);
    /* should change node count when option increases */
    mpp_opt_setup(opts, cmd);

    for (i = 0; i < enc_opt_cnt; i++)
        mpp_opt_add(opts, &enc_opts[i]);

    /* mark option end */
    mpp_opt_add(opts, NULL);
    ret = mpp_opt_parse(opts, argc, argv);
    /* check essential parameter */
    if (cmd->type <= MPP_VIDEO_CodingAutoDetect) {
        mpp_err("invalid type %d\n", cmd->type);
        ret = MPP_NOK;
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_BUTT)
        cmd->rc_mode = (cmd->type == MPP_VIDEO_CodingMJPEG) ?
                       MPP_ENC_RC_MODE_FIXQP : MPP_ENC_RC_MODE_VBR;

    if (!cmd->hor_stride)
        cmd->hor_stride = mpi_enc_width_default_stride(cmd->width, cmd->format);
    if (!cmd->ver_stride)
        cmd->ver_stride = MPP_ALIGN(cmd->height, 2);

    if (cmd->type_src == MPP_VIDEO_CodingUnused) {
        if (cmd->width <= 0 || cmd->height <= 0 ||
            cmd->hor_stride <= 0 || cmd->ver_stride <= 0) {
            mpp_err("invalid w:h [%d:%d] stride [%d:%d]\n",
                    cmd->width, cmd->height, cmd->hor_stride, cmd->ver_stride);
            ret = MPP_NOK;
        }
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_FIXQP) {
        if (!cmd->qp_init) {
            if (cmd->type == MPP_VIDEO_CodingAVC ||
                cmd->type == MPP_VIDEO_CodingHEVC)
                cmd->qp_init = 26;
        }
    }

    if (cmd->trace_fps) {
        fps_calc_init(&cmd->fps);
        mpp_assert(cmd->fps);
        fps_calc_set_cb(cmd->fps, show_enc_fps);
    }

done:
    if (opts) {
        mpp_opt_deinit(opts);
        opts = NULL;
    }
    if (ret)
        mpi_enc_show_help(argv[0]);

    return ret;
}